

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>::
~CartesianProductGenerator
          (CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int>
           *this)

{
  ~CartesianProductGenerator(this);
  operator_delete(this);
  return;
}

Assistant:

~CartesianProductGenerator() override {}